

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECPublicKey.cpp
# Opt level: O0

bool __thiscall ECPublicKey::deserialise(ECPublicKey *this,ByteString *serialised)

{
  size_t sVar1;
  long *in_RDI;
  ByteString dQ;
  ByteString dEC;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined1 local_68 [40];
  undefined1 local_40 [63];
  byte local_1;
  
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  ByteString::chainDeserialise
            ((ByteString *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  sVar1 = ByteString::size((ByteString *)0x1a7924);
  if (sVar1 != 0) {
    sVar1 = ByteString::size((ByteString *)0x1a7940);
    if (sVar1 != 0) {
      (**(code **)(*in_RDI + 0x38))(in_RDI,local_40);
      (**(code **)(*in_RDI + 0x40))(in_RDI,local_68);
      local_1 = 1;
      goto LAB_001a79c8;
    }
  }
  local_1 = 0;
LAB_001a79c8:
  ByteString::~ByteString((ByteString *)0x1a79d2);
  ByteString::~ByteString((ByteString *)0x1a79dc);
  return (bool)(local_1 & 1);
}

Assistant:

bool ECPublicKey::deserialise(ByteString& serialised)
{
	ByteString dEC = ByteString::chainDeserialise(serialised);
	ByteString dQ = ByteString::chainDeserialise(serialised);

	if ((dEC.size() == 0) ||
	    (dQ.size() == 0))
	{
		return false;
	}

	setEC(dEC);
	setQ(dQ);

	return true;
}